

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

void __thiscall
Catch::UnaryExpr<bool>::streamReconstructedExpression(UnaryExpr<bool> *this,ostream *os)

{
  char *pcVar1;
  long lVar2;
  char local_20 [5];
  char acStack_1b [11];
  
  if ((this->super_ITransientExpression).field_0xa == '\x01') {
    pcVar1 = local_20 + 4;
    builtin_strncpy(local_20,"true",4);
    lVar2 = 4;
  }
  else {
    pcVar1 = acStack_1b;
    stack0xffffffffffffffe4 = CONCAT31(acStack_1b._0_3_,0x65);
    builtin_strncpy(local_20,"fals",4);
    lVar2 = 5;
  }
  *pcVar1 = '\0';
  std::__ostream_insert<char,std::char_traits<char>>(os,local_20,lVar2);
  return;
}

Assistant:

inline IMutableContext& getCurrentMutableContext()
    {
        if( !IMutableContext::currentContext )
            IMutableContext::createContext();
        // NOLINTNEXTLINE(clang-analyzer-core.uninitialized.UndefReturn)
        return *IMutableContext::currentContext;
    }